

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImRect::ClipWithFull(ImRect *this,ImRect *r)

{
  ImVec2 IVar1;
  
  IVar1 = ImClamp(&this->Min,&r->Min,r->Max);
  this->Min = IVar1;
  IVar1 = ImClamp(&this->Max,&r->Min,r->Max);
  this->Max = IVar1;
  return;
}

Assistant:

void        Floor()                             { Min.x = IM_FLOOR(Min.x); Min.y = IM_FLOOR(Min.y); Max.x = IM_FLOOR(Max.x); Max.y = IM_FLOOR(Max.y); }